

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_syntax_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  char *datatype;
  char *longopts;
  char *shortopts;
  char syntax [200];
  int tabindex;
  int i;
  arg_hdr **table;
  char *suffix_local;
  void **argtable_local;
  arg_dstr_t ds_local;
  
  arg_print_gnuswitch_ds(ds,(arg_hdr **)argtable);
  syntax[0xc0] = '\0';
  syntax[0xc1] = '\0';
  syntax[0xc2] = '\0';
  syntax[0xc3] = '\0';
  while( true ) {
    bVar5 = false;
    if (argtable[(int)syntax._192_4_] != (void *)0x0) {
      bVar5 = (*argtable[(int)syntax._192_4_] & 1) == 0;
    }
    if (!bVar5) break;
    memset(&shortopts,0,200);
    if ((*(long *)((long)argtable[(int)syntax._192_4_] + 8) == 0) ||
       ((*argtable[(int)syntax._192_4_] & 2) != 0)) {
      arg_cat_option((char *)&shortopts,199,*(char **)((long)argtable[(int)syntax._192_4_] + 8),
                     *(char **)((long)argtable[(int)syntax._192_4_] + 0x10),
                     *(char **)((long)argtable[(int)syntax._192_4_] + 0x18),
                     (int)*argtable[(int)syntax._192_4_] & 4);
      sVar4 = strlen((char *)&shortopts);
      if (sVar4 != 0) {
        syntax[0xc4] = '\0';
        syntax[0xc5] = '\0';
        syntax[0xc6] = '\0';
        syntax[199] = '\0';
        for (; (int)syntax._196_4_ < *(int *)((long)argtable[(int)syntax._192_4_] + 0x28);
            syntax._196_4_ = syntax._196_4_ + 1) {
          arg_dstr_cat(ds," ");
          arg_dstr_cat(ds,(char *)&shortopts);
        }
        iVar1 = *(int *)((long)argtable[(int)syntax._192_4_] + 0x28);
        iVar2 = *(int *)((long)argtable[(int)syntax._192_4_] + 0x2c);
        iVar3 = iVar2 - iVar1;
        if (iVar2 != iVar1) {
          if (iVar3 == 1) {
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,(char *)&shortopts);
            arg_dstr_cat(ds,"]");
          }
          else if (iVar3 == 2) {
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,(char *)&shortopts);
            arg_dstr_cat(ds,"]");
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,(char *)&shortopts);
            arg_dstr_cat(ds,"]");
          }
          else {
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,(char *)&shortopts);
            arg_dstr_cat(ds,"]...");
          }
        }
      }
    }
    syntax._192_4_ = syntax._192_4_ + 1;
  }
  if (suffix != (char *)0x0) {
    arg_dstr_cat(ds,suffix);
  }
  return;
}

Assistant:

void arg_print_syntax_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print GNU style [OPTION] string */
    arg_print_gnuswitch_ds(ds, table);

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        /* skip short options without arg values (they were printed by arg_print_gnu_switch) */
        if (table[tabindex]->shortopts && !(table[tabindex]->flag & ARG_HASVALUE))
            continue;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_option(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE);

        if (strlen(syntax) > 0) {
            /* print mandatory instances of this option */
            for (i = 0; i < table[tabindex]->mincount; i++) {
                arg_dstr_cat(ds, " ");
                arg_dstr_cat(ds, syntax);
            }

            /* print optional instances enclosed in "[..]" */
            switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
                case 0:
                    break;
                case 1:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                case 2:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                default:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]...");
                    break;
            }
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}